

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1parse.c
# Opt level: O3

int mbedtls_asn1_get_alg(uchar **p,uchar *end,mbedtls_asn1_buf *alg,mbedtls_asn1_buf *params)

{
  uchar *puVar1;
  int iVar2;
  byte *pbVar3;
  int iVar4;
  byte *end_00;
  size_t len;
  size_t local_30;
  
  puVar1 = *p;
  iVar4 = -0x60;
  iVar2 = iVar4;
  if (end != puVar1 && -1 < (long)end - (long)puVar1) {
    if (*puVar1 == '0') {
      *p = puVar1 + 1;
      iVar2 = mbedtls_asn1_get_len(p,end,&local_30);
      if ((((iVar2 == 0) &&
           (pbVar3 = *p, iVar2 = iVar4, end != pbVar3 && -1 < (long)end - (long)pbVar3)) &&
          (alg->tag = (uint)*pbVar3, 0 < (long)local_30)) && (iVar2 = -0x62, *pbVar3 == 6)) {
        end_00 = pbVar3 + local_30;
        *p = pbVar3 + 1;
        iVar2 = mbedtls_asn1_get_len(p,end_00,&alg->len);
        if (iVar2 == 0) {
          puVar1 = *p;
          alg->p = puVar1;
          pbVar3 = puVar1 + alg->len;
          *p = pbVar3;
          if (pbVar3 == end_00) {
            mbedtls_platform_zeroize(params,0x18);
            iVar2 = 0;
          }
          else {
            params->tag = (uint)*pbVar3;
            *p = pbVar3 + 1;
            iVar2 = mbedtls_asn1_get_len(p,end_00,&params->len);
            if (iVar2 == 0) {
              puVar1 = *p;
              params->p = puVar1;
              pbVar3 = puVar1 + params->len;
              *p = pbVar3;
              iVar2 = -0x66;
              if (pbVar3 == end_00) {
                iVar2 = 0;
              }
            }
          }
        }
      }
    }
    else {
      iVar2 = -0x62;
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_asn1_get_alg( unsigned char **p,
                  const unsigned char *end,
                  mbedtls_asn1_buf *alg, mbedtls_asn1_buf *params )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t len;

    if( ( ret = mbedtls_asn1_get_tag( p, end, &len,
            MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
        return( ret );

    if( ( end - *p ) < 1 )
        return( MBEDTLS_ERR_ASN1_OUT_OF_DATA );

    alg->tag = **p;
    end = *p + len;

    if( ( ret = mbedtls_asn1_get_tag( p, end, &alg->len, MBEDTLS_ASN1_OID ) ) != 0 )
        return( ret );

    alg->p = *p;
    *p += alg->len;

    if( *p == end )
    {
        mbedtls_platform_zeroize( params, sizeof(mbedtls_asn1_buf) );
        return( 0 );
    }

    params->tag = **p;
    (*p)++;

    if( ( ret = mbedtls_asn1_get_len( p, end, &params->len ) ) != 0 )
        return( ret );

    params->p = *p;
    *p += params->len;

    if( *p != end )
        return( MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );

    return( 0 );
}